

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Swish_x86_avx512::forward_inplace(Swish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  bool bVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 (*pauVar23) [64];
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar30 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar35 [32];
  
  iVar22 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar36 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar37 = vxorps_avx512dq(auVar36,(undefined1  [64])_ps512_cephes_exp_C1);
  auVar36 = vxorps_avx512dq(auVar36,(undefined1  [64])_ps512_cephes_exp_C2);
  uVar26 = 0;
  uVar25 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar25 = uVar26;
  }
  for (; uVar26 != uVar25; uVar26 = uVar26 + 1) {
    pauVar23 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar24 = 0; iVar24 + 0xf < iVar22; iVar24 = iVar24 + 0x10) {
      auVar42 = *pauVar23;
      auVar38._8_4_ = 0x80000000;
      auVar38._0_8_ = 0x8000000080000000;
      auVar38._12_4_ = 0x80000000;
      auVar38._16_4_ = 0x80000000;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      auVar38._32_4_ = 0x80000000;
      auVar38._36_4_ = 0x80000000;
      auVar38._40_4_ = 0x80000000;
      auVar38._44_4_ = 0x80000000;
      auVar38._48_4_ = 0x80000000;
      auVar38._52_4_ = 0x80000000;
      auVar38._56_4_ = 0x80000000;
      auVar38._60_4_ = 0x80000000;
      auVar38 = vxorps_avx512dq(auVar42,auVar38);
      auVar38 = vminps_avx512f(auVar38,(undefined1  [64])_ps512_exp_hi);
      auVar38 = vmaxps_avx512f(auVar38,(undefined1  [64])_ps512_exp_lo);
      auVar39 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_LOG2EF,auVar38,
                                    (undefined1  [64])_ps512_cephes_exp_p5);
      auVar40 = vrndscaleps_avx512f(auVar39,1);
      uVar5 = vcmpps_avx512f(auVar39,auVar40,1);
      auVar39 = vsubps_avx512f(auVar40,(undefined1  [64])_ps512_1);
      bVar4 = (bool)((byte)uVar5 & 1);
      auVar41._0_4_ = (uint)bVar4 * auVar39._0_4_ | (uint)!bVar4 * auVar40._0_4_;
      bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar4 * auVar39._4_4_ | (uint)!bVar4 * auVar40._4_4_;
      bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar4 * auVar39._8_4_ | (uint)!bVar4 * auVar40._8_4_;
      bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar4 * auVar39._12_4_ | (uint)!bVar4 * auVar40._12_4_;
      bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar41._16_4_ = (uint)bVar4 * auVar39._16_4_ | (uint)!bVar4 * auVar40._16_4_;
      bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar41._20_4_ = (uint)bVar4 * auVar39._20_4_ | (uint)!bVar4 * auVar40._20_4_;
      bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar41._24_4_ = (uint)bVar4 * auVar39._24_4_ | (uint)!bVar4 * auVar40._24_4_;
      bVar4 = (bool)((byte)(uVar5 >> 7) & 1);
      auVar41._28_4_ = (uint)bVar4 * auVar39._28_4_ | (uint)!bVar4 * auVar40._28_4_;
      bVar4 = (bool)((byte)(uVar5 >> 8) & 1);
      auVar41._32_4_ = (uint)bVar4 * auVar39._32_4_ | (uint)!bVar4 * auVar40._32_4_;
      bVar4 = (bool)((byte)(uVar5 >> 9) & 1);
      auVar41._36_4_ = (uint)bVar4 * auVar39._36_4_ | (uint)!bVar4 * auVar40._36_4_;
      bVar4 = (bool)((byte)(uVar5 >> 10) & 1);
      auVar41._40_4_ = (uint)bVar4 * auVar39._40_4_ | (uint)!bVar4 * auVar40._40_4_;
      bVar4 = (bool)((byte)(uVar5 >> 0xb) & 1);
      auVar41._44_4_ = (uint)bVar4 * auVar39._44_4_ | (uint)!bVar4 * auVar40._44_4_;
      bVar4 = (bool)((byte)(uVar5 >> 0xc) & 1);
      auVar41._48_4_ = (uint)bVar4 * auVar39._48_4_ | (uint)!bVar4 * auVar40._48_4_;
      bVar4 = (bool)((byte)(uVar5 >> 0xd) & 1);
      auVar41._52_4_ = (uint)bVar4 * auVar39._52_4_ | (uint)!bVar4 * auVar40._52_4_;
      bVar4 = (bool)((byte)(uVar5 >> 0xe) & 1);
      auVar41._56_4_ = (uint)bVar4 * auVar39._56_4_ | (uint)!bVar4 * auVar40._56_4_;
      bVar4 = SUB81(uVar5 >> 0xf,0);
      auVar41._60_4_ = (uint)bVar4 * auVar39._60_4_ | (uint)!bVar4 * auVar40._60_4_;
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar41,auVar37);
      auVar38 = vfmadd231ps_avx512f(auVar38,auVar41,auVar36);
      auVar39 = vmulps_avx512f(auVar38,auVar38);
      auVar40 = vfmadd132ps_avx512f(auVar38,(undefined1  [64])_ps512_cephes_exp_p1,
                                    (undefined1  [64])_ps512_cephes_exp_p0);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])_ps512_cephes_exp_p2);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])_ps512_cephes_exp_p3);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])_ps512_cephes_exp_p4);
      auVar40 = vfmadd213ps_avx512f(auVar40,auVar38,(undefined1  [64])_ps512_cephes_exp_p5);
      auVar38 = vfmadd213ps_avx512f(auVar40,auVar39,auVar38);
      auVar38 = vaddps_avx512f(auVar38,(undefined1  [64])_ps512_1);
      auVar39 = vcvttps2dq_avx512f(auVar41);
      auVar39 = vpaddd_avx512f(auVar39,(undefined1  [64])_pi32_512_0x7f);
      auVar40 = vpslld_avx512f(auVar39,0x17);
      auVar39._8_4_ = 0x3f800000;
      auVar39._0_8_ = 0x3f8000003f800000;
      auVar39._12_4_ = 0x3f800000;
      auVar39._16_4_ = 0x3f800000;
      auVar39._20_4_ = 0x3f800000;
      auVar39._24_4_ = 0x3f800000;
      auVar39._28_4_ = 0x3f800000;
      auVar39._32_4_ = 0x3f800000;
      auVar39._36_4_ = 0x3f800000;
      auVar39._40_4_ = 0x3f800000;
      auVar39._44_4_ = 0x3f800000;
      auVar39._48_4_ = 0x3f800000;
      auVar39._52_4_ = 0x3f800000;
      auVar39._56_4_ = 0x3f800000;
      auVar39._60_4_ = 0x3f800000;
      auVar38 = vfmadd213ps_avx512f(auVar40,auVar38,auVar39);
      auVar39 = vrcp14ps_avx512f(auVar38);
      auVar40 = vmulps_avx512f(auVar42,auVar39);
      auVar42 = vfmsub213ps_avx512f(auVar38,auVar40,auVar42);
      auVar42 = vfnmadd213ps_avx512f(auVar42,auVar39,auVar40);
      *pauVar23 = auVar42;
      pauVar23 = pauVar23 + 1;
    }
    for (; iVar24 + 7 < iVar22; iVar24 = iVar24 + 8) {
      auVar3 = *(undefined1 (*) [32])*pauVar23;
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar31 = vxorps_avx512vl(auVar3,auVar31);
      auVar32._8_4_ = 0x42b0c0a5;
      auVar32._0_8_ = 0x42b0c0a542b0c0a5;
      auVar32._12_4_ = 0x42b0c0a5;
      auVar32._16_4_ = 0x42b0c0a5;
      auVar32._20_4_ = 0x42b0c0a5;
      auVar32._24_4_ = 0x42b0c0a5;
      auVar32._28_4_ = 0x42b0c0a5;
      auVar31 = vminps_avx512vl(auVar31,auVar32);
      auVar33._8_4_ = 0xc2b0c0a5;
      auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._12_4_ = 0xc2b0c0a5;
      auVar33._16_4_ = 0xc2b0c0a5;
      auVar33._20_4_ = 0xc2b0c0a5;
      auVar33._24_4_ = 0xc2b0c0a5;
      auVar33._28_4_ = 0xc2b0c0a5;
      auVar32 = vmaxps_avx512vl(auVar31,auVar33);
      auVar55._8_4_ = 0x3f000000;
      auVar55._0_8_ = 0x3f0000003f000000;
      auVar55._12_4_ = 0x3f000000;
      auVar55._16_4_ = 0x3f000000;
      auVar55._20_4_ = 0x3f000000;
      auVar55._24_4_ = 0x3f000000;
      auVar55._28_4_ = 0x3f000000;
      auVar34._8_4_ = 0x3fb8aa3b;
      auVar34._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar34._12_4_ = 0x3fb8aa3b;
      auVar34._16_4_ = 0x3fb8aa3b;
      auVar34._20_4_ = 0x3fb8aa3b;
      auVar34._24_4_ = 0x3fb8aa3b;
      auVar34._28_4_ = 0x3fb8aa3b;
      auVar33 = vfmadd231ps_avx512vl(auVar55,auVar32,auVar34);
      auVar31 = vroundps_avx(auVar33,1);
      uVar5 = vcmpps_avx512vl(auVar33,auVar31,1);
      auVar57._8_4_ = 0x3f800000;
      auVar57._0_8_ = 0x3f8000003f800000;
      auVar57._12_4_ = 0x3f800000;
      auVar57._16_4_ = 0x3f800000;
      auVar57._20_4_ = 0x3f800000;
      auVar57._24_4_ = 0x3f800000;
      auVar57._28_4_ = 0x3f800000;
      auVar34 = vsubps_avx512vl(auVar31,auVar57);
      bVar4 = (bool)((byte)uVar5 & 1);
      auVar35._0_4_ = (float)((uint)bVar4 * auVar34._0_4_ | (uint)!bVar4 * auVar31._0_4_);
      bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar35._4_4_ = (float)((uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * auVar31._4_4_);
      bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar35._8_4_ = (float)((uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * auVar31._8_4_);
      bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar35._12_4_ = (float)((uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * auVar31._12_4_);
      bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar35._16_4_ = (float)((uint)bVar4 * auVar34._16_4_ | (uint)!bVar4 * auVar31._16_4_);
      bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar35._20_4_ = (float)((uint)bVar4 * auVar34._20_4_ | (uint)!bVar4 * auVar31._20_4_);
      bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar35._24_4_ = (float)((uint)bVar4 * auVar34._24_4_ | (uint)!bVar4 * auVar31._24_4_);
      bVar4 = SUB81(uVar5 >> 7,0);
      auVar35._28_4_ = (float)((uint)bVar4 * auVar34._28_4_ | (uint)!bVar4 * auVar31._28_4_);
      auVar13._8_4_ = 0x3f318000;
      auVar13._0_8_ = 0x3f3180003f318000;
      auVar13._12_4_ = 0x3f318000;
      auVar13._16_4_ = 0x3f318000;
      auVar13._20_4_ = 0x3f318000;
      auVar13._24_4_ = 0x3f318000;
      auVar13._28_4_ = 0x3f318000;
      auVar31 = vfmsub231ps_avx512vl(auVar32,auVar35,auVar13);
      auVar14._8_4_ = 0x395e8083;
      auVar14._0_8_ = 0x395e8083395e8083;
      auVar14._12_4_ = 0x395e8083;
      auVar14._16_4_ = 0x395e8083;
      auVar14._20_4_ = 0x395e8083;
      auVar14._24_4_ = 0x395e8083;
      auVar14._28_4_ = 0x395e8083;
      auVar31 = vfmsub231ps_avx512vl(auVar31,auVar35,auVar14);
      auVar20._4_4_ = auVar31._4_4_ * auVar31._4_4_;
      auVar20._0_4_ = auVar31._0_4_ * auVar31._0_4_;
      auVar20._8_4_ = auVar31._8_4_ * auVar31._8_4_;
      auVar20._12_4_ = auVar31._12_4_ * auVar31._12_4_;
      auVar20._16_4_ = auVar31._16_4_ * auVar31._16_4_;
      auVar20._20_4_ = auVar31._20_4_ * auVar31._20_4_;
      auVar20._24_4_ = auVar31._24_4_ * auVar31._24_4_;
      auVar20._28_4_ = auVar33._28_4_;
      auVar53._8_4_ = 0x39506967;
      auVar53._0_8_ = 0x3950696739506967;
      auVar53._12_4_ = 0x39506967;
      auVar53._16_4_ = 0x39506967;
      auVar53._20_4_ = 0x39506967;
      auVar53._24_4_ = 0x39506967;
      auVar53._28_4_ = 0x39506967;
      auVar15._8_4_ = 0x3ab743ce;
      auVar15._0_8_ = 0x3ab743ce3ab743ce;
      auVar15._12_4_ = 0x3ab743ce;
      auVar15._16_4_ = 0x3ab743ce;
      auVar15._20_4_ = 0x3ab743ce;
      auVar15._24_4_ = 0x3ab743ce;
      auVar15._28_4_ = 0x3ab743ce;
      auVar32 = vfmadd213ps_avx512vl(auVar53,auVar31,auVar15);
      auVar16._8_4_ = 0x3c088908;
      auVar16._0_8_ = 0x3c0889083c088908;
      auVar16._12_4_ = 0x3c088908;
      auVar16._16_4_ = 0x3c088908;
      auVar16._20_4_ = 0x3c088908;
      auVar16._24_4_ = 0x3c088908;
      auVar16._28_4_ = 0x3c088908;
      auVar32 = vfmadd213ps_avx512vl(auVar32,auVar31,auVar16);
      auVar17._8_4_ = 0x3d2aa9c1;
      auVar17._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar17._12_4_ = 0x3d2aa9c1;
      auVar17._16_4_ = 0x3d2aa9c1;
      auVar17._20_4_ = 0x3d2aa9c1;
      auVar17._24_4_ = 0x3d2aa9c1;
      auVar17._28_4_ = 0x3d2aa9c1;
      auVar32 = vfmadd213ps_avx512vl(auVar32,auVar31,auVar17);
      auVar18._8_4_ = 0x3e2aaaaa;
      auVar18._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar18._12_4_ = 0x3e2aaaaa;
      auVar18._16_4_ = 0x3e2aaaaa;
      auVar18._20_4_ = 0x3e2aaaaa;
      auVar18._24_4_ = 0x3e2aaaaa;
      auVar18._28_4_ = 0x3e2aaaaa;
      auVar32 = vfmadd213ps_avx512vl(auVar32,auVar31,auVar18);
      auVar2 = vfmadd213ps_fma(auVar32,auVar31,auVar55);
      auVar2 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar20,auVar31);
      auVar46._0_4_ = auVar2._0_4_ + 1.0;
      auVar46._4_4_ = auVar2._4_4_ + 1.0;
      auVar46._8_4_ = auVar2._8_4_ + 1.0;
      auVar46._12_4_ = auVar2._12_4_ + 1.0;
      auVar46._16_4_ = 0x3f800000;
      auVar46._20_4_ = 0x3f800000;
      auVar46._24_4_ = 0x3f800000;
      auVar46._28_4_ = 0x3f800000;
      auVar49._0_4_ = (int)auVar35._0_4_;
      auVar49._4_4_ = (int)auVar35._4_4_;
      auVar49._8_4_ = (int)auVar35._8_4_;
      auVar49._12_4_ = (int)auVar35._12_4_;
      auVar49._16_4_ = (int)auVar35._16_4_;
      auVar49._20_4_ = (int)auVar35._20_4_;
      auVar49._24_4_ = (int)auVar35._24_4_;
      auVar49._28_4_ = (int)auVar35._28_4_;
      auVar31 = vpslld_avx2(auVar49,0x17);
      auVar19._8_4_ = 0x3f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._12_4_ = 0x3f800000;
      auVar19._16_4_ = 0x3f800000;
      auVar19._20_4_ = 0x3f800000;
      auVar19._24_4_ = 0x3f800000;
      auVar19._28_4_ = 0x3f800000;
      auVar31 = vpaddd_avx512vl(auVar31,auVar19);
      auVar2 = vfmadd213ps_fma(auVar31,auVar46,auVar57);
      auVar31 = vrcpps_avx(ZEXT1632(auVar2));
      auVar21._4_4_ = auVar3._4_4_ * auVar31._4_4_;
      auVar21._0_4_ = auVar3._0_4_ * auVar31._0_4_;
      auVar21._8_4_ = auVar3._8_4_ * auVar31._8_4_;
      auVar21._12_4_ = auVar3._12_4_ * auVar31._12_4_;
      auVar21._16_4_ = auVar3._16_4_ * auVar31._16_4_;
      auVar21._20_4_ = auVar3._20_4_ * auVar31._20_4_;
      auVar21._24_4_ = auVar3._24_4_ * auVar31._24_4_;
      auVar21._28_4_ = auVar35._28_4_;
      auVar2 = vfmsub213ps_fma(ZEXT1632(auVar2),auVar21,auVar3);
      auVar2 = vfnmadd213ps_fma(ZEXT1632(auVar2),auVar31,auVar21);
      *(undefined1 (*) [32])*pauVar23 = ZEXT1632(auVar2);
      pauVar23 = (undefined1 (*) [64])(*pauVar23 + 0x20);
    }
    for (; iVar24 + 3 < iVar22; iVar24 = iVar24 + 4) {
      auVar2 = *(undefined1 (*) [16])*pauVar23;
      auVar44._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
      auVar44._8_4_ = -auVar2._8_4_;
      auVar44._12_4_ = -auVar2._12_4_;
      auVar27._8_4_ = 0x42b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar27._12_4_ = 0x42b0c0a5;
      auVar27 = vminps_avx512vl(auVar44,auVar27);
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      auVar28 = vmaxps_avx512vl(auVar27,auVar28);
      auVar54._8_4_ = 0x3f000000;
      auVar54._0_8_ = 0x3f0000003f000000;
      auVar54._12_4_ = 0x3f000000;
      auVar29._8_4_ = 0x3fb8aa3b;
      auVar29._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar29._12_4_ = 0x3fb8aa3b;
      auVar29 = vfmadd231ps_avx512vl(auVar54,auVar28,auVar29);
      auVar50._0_4_ = (int)auVar29._0_4_;
      auVar50._4_4_ = (int)auVar29._4_4_;
      auVar50._8_4_ = (int)auVar29._8_4_;
      auVar50._12_4_ = (int)auVar29._12_4_;
      auVar27 = vcvtdq2ps_avx(auVar50);
      uVar5 = vcmpps_avx512vl(auVar29,auVar27,1);
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar29 = vsubps_avx512vl(auVar27,auVar56);
      bVar4 = (bool)((byte)uVar5 & 1);
      auVar30._0_4_ = (float)((uint)bVar4 * auVar29._0_4_ | (uint)!bVar4 * auVar27._0_4_);
      bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar30._4_4_ = (float)((uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * auVar27._4_4_);
      bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar30._8_4_ = (float)((uint)bVar4 * auVar29._8_4_ | (uint)!bVar4 * auVar27._8_4_);
      bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar30._12_4_ = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * auVar27._12_4_);
      auVar6._8_4_ = 0x3f318000;
      auVar6._0_8_ = 0x3f3180003f318000;
      auVar6._12_4_ = 0x3f318000;
      auVar27 = vfmsub231ps_avx512vl(auVar28,auVar30,auVar6);
      auVar7._8_4_ = 0x395e8083;
      auVar7._0_8_ = 0x395e8083395e8083;
      auVar7._12_4_ = 0x395e8083;
      auVar28 = vfmsub231ps_avx512vl(auVar27,auVar30,auVar7);
      auVar47._0_4_ = auVar28._0_4_ * auVar28._0_4_;
      auVar47._4_4_ = auVar28._4_4_ * auVar28._4_4_;
      auVar47._8_4_ = auVar28._8_4_ * auVar28._8_4_;
      auVar47._12_4_ = auVar28._12_4_ * auVar28._12_4_;
      auVar52._8_4_ = 0x39506967;
      auVar52._0_8_ = 0x3950696739506967;
      auVar52._12_4_ = 0x39506967;
      auVar8._8_4_ = 0x3ab743ce;
      auVar8._0_8_ = 0x3ab743ce3ab743ce;
      auVar8._12_4_ = 0x3ab743ce;
      auVar27 = vfmadd213ps_avx512vl(auVar52,auVar28,auVar8);
      auVar9._8_4_ = 0x3c088908;
      auVar9._0_8_ = 0x3c0889083c088908;
      auVar9._12_4_ = 0x3c088908;
      auVar27 = vfmadd213ps_avx512vl(auVar27,auVar28,auVar9);
      auVar10._8_4_ = 0x3d2aa9c1;
      auVar10._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar10._12_4_ = 0x3d2aa9c1;
      auVar27 = vfmadd213ps_avx512vl(auVar27,auVar28,auVar10);
      auVar11._8_4_ = 0x3e2aaaaa;
      auVar11._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar11._12_4_ = 0x3e2aaaaa;
      auVar27 = vfmadd213ps_avx512vl(auVar27,auVar28,auVar11);
      auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar54);
      auVar27 = vfmadd213ps_fma(auVar27,auVar47,auVar28);
      auVar45._0_4_ = auVar27._0_4_ + 1.0;
      auVar45._4_4_ = auVar27._4_4_ + 1.0;
      auVar45._8_4_ = auVar27._8_4_ + 1.0;
      auVar45._12_4_ = auVar27._12_4_ + 1.0;
      auVar48._0_4_ = (int)auVar30._0_4_;
      auVar48._4_4_ = (int)auVar30._4_4_;
      auVar48._8_4_ = (int)auVar30._8_4_;
      auVar48._12_4_ = (int)auVar30._12_4_;
      auVar27 = vpslld_avx(auVar48,0x17);
      auVar12._8_4_ = 0x3f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      auVar12._12_4_ = 0x3f800000;
      auVar27 = vpaddd_avx512vl(auVar27,auVar12);
      auVar28 = vfmadd213ps_fma(auVar27,auVar45,auVar56);
      auVar27 = vrcpps_avx(auVar28);
      auVar51._0_4_ = auVar2._0_4_ * auVar27._0_4_;
      auVar51._4_4_ = auVar2._4_4_ * auVar27._4_4_;
      auVar51._8_4_ = auVar2._8_4_ * auVar27._8_4_;
      auVar51._12_4_ = auVar2._12_4_ * auVar27._12_4_;
      auVar2 = vfmsub213ps_fma(auVar28,auVar51,auVar2);
      auVar2 = vfnmadd213ps_fma(auVar2,auVar27,auVar51);
      *(undefined1 (*) [16])*pauVar23 = auVar2;
      pauVar23 = (undefined1 (*) [64])(*pauVar23 + 0x10);
    }
    for (; iVar24 < iVar22; iVar24 = iVar24 + 1) {
      fVar1 = *(float *)*pauVar23;
      fVar43 = expf(-fVar1);
      *(float *)*pauVar23 = fVar1 / (fVar43 + 1.0);
      pauVar23 = (undefined1 (*) [64])(*pauVar23 + 4);
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}